

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementSpring.cpp
# Opt level: O1

double __thiscall chrono::fea::ChElementSpring::GetCurrentForce(ChElementSpring *this)

{
  pointer psVar1;
  element_type *peVar2;
  element_type *peVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  
  psVar1 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar2 = (psVar1->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar3 = psVar1[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  dVar4 = *(double *)((long)&peVar3->super_ChNodeFEAbase + 0x20) -
          *(double *)((long)&peVar2->super_ChNodeFEAbase + 0x20);
  dVar5 = *(double *)&peVar3->field_0x28 - *(double *)&peVar2->field_0x28;
  dVar6 = *(double *)&peVar3->field_0x30 - *(double *)&peVar2->field_0x30;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar5 * dVar5;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar4;
  auVar13 = vfmadd231sd_fma(auVar13,auVar19,auVar19);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar6;
  auVar13 = vfmadd231sd_fma(auVar13,auVar24,auVar24);
  if (auVar13._0_8_ < 0.0) {
    dVar10 = sqrt(auVar13._0_8_);
  }
  else {
    auVar13 = vsqrtsd_avx(auVar13,auVar13);
    dVar10 = auVar13._0_8_;
  }
  bVar7 = 2.2250738585072014e-308 <= dVar10;
  dVar10 = 1.0 / dVar10;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_30);
  (**(code **)(*(long *)&((((this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_48);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = (local_28 - local_40) * (local_28 - local_40);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_30 - local_48;
  auVar13 = vfmadd231sd_fma(auVar14,auVar20,auVar20);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_20 - local_38;
  auVar13 = vfmadd231sd_fma(auVar13,auVar16,auVar16);
  if (auVar13._0_8_ < 0.0) {
    dVar11 = sqrt(auVar13._0_8_);
  }
  else {
    auVar13 = vsqrtsd_avx(auVar13,auVar13);
    dVar11 = auVar13._0_8_;
  }
  psVar1 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar2 = (psVar1->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar3 = psVar1[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  dVar12 = *(double *)&peVar3->field_0x28 - *(double *)&peVar2->field_0x28;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar12 * dVar12;
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       *(double *)((long)&peVar3->super_ChNodeFEAbase + 0x20) -
       *(double *)((long)&peVar2->super_ChNodeFEAbase + 0x20);
  auVar13 = vfmadd231sd_fma(auVar15,auVar21,auVar21);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(double *)&peVar3->field_0x30 - *(double *)&peVar2->field_0x30;
  auVar13 = vfmadd231sd_fma(auVar13,auVar17,auVar17);
  if (auVar13._0_8_ < 0.0) {
    dVar12 = sqrt(auVar13._0_8_);
  }
  else {
    auVar13 = vsqrtsd_avx(auVar13,auVar13);
    dVar12 = auVar13._0_8_;
  }
  psVar1 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar2 = (psVar1->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar3 = psVar1[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (ulong)bVar7 * (long)(dVar4 * dVar10) + (ulong)!bVar7 * 0x3ff0000000000000;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(double *)&peVar3->field_0x38 - *(double *)&peVar2->field_0x38;
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (*(double *)&peVar3->field_0x40 - *(double *)&peVar2->field_0x40) *
       (double)((ulong)bVar7 * (long)(dVar5 * dVar10));
  auVar13 = vfmadd213sd_fma(auVar9,auVar18,auVar22);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (ulong)bVar7 * (long)(dVar6 * dVar10);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(double *)&peVar3->field_0x48 - *(double *)&peVar2->field_0x48;
  auVar13 = vfmadd213sd_fma(auVar8,auVar23,auVar13);
  return (dVar12 - dVar11) * this->spring_k + auVar13._0_8_ * this->damper_r;
}

Assistant:

double ChElementSpring::GetCurrentForce() {
	ChVector<> dir = (nodes[1]->GetPos() - nodes[0]->GetPos()).GetNormalized();
	double L_ref = (nodes[1]->GetX0() - nodes[0]->GetX0()).Length();
    double L = (nodes[1]->GetPos() - nodes[0]->GetPos()).Length();
    double L_dt = Vdot((nodes[1]->GetPos_dt() - nodes[0]->GetPos_dt()), dir);
    double internal_Kforce_local = this->spring_k * (L - L_ref);
    double internal_Rforce_local = this->damper_r * L_dt;
	return internal_Kforce_local + internal_Rforce_local;
}